

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

ktx_error_code_e ktxMemStream_setpos(ktxStream *str,ktx_off_t pos)

{
  ulong in_RSI;
  long in_RDI;
  ktx_error_code_e local_4;
  
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    if (*(int *)(in_RDI + 0x38) != 2) {
      __assert_fail("str->type == eStreamTypeMemory",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/memstream.c"
                    ,0x185,"ktx_error_code_e ktxMemStream_setpos(ktxStream *, ktx_off_t)");
    }
    if (((long)in_RSI < 0) || (*(ulong *)(*(long *)(in_RDI + 0x40) + 0x10) < in_RSI)) {
      local_4 = KTX_INVALID_OPERATION;
    }
    else {
      *(ulong *)(*(long *)(in_RDI + 0x40) + 0x20) = in_RSI;
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxMemStream_setpos(ktxStream* str, ktx_off_t pos)
{
    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeMemory);

    if (pos < 0 || (ktx_size_t)pos > str->data.mem->alloc_size)
        return KTX_INVALID_OPERATION;

    str->data.mem->pos = pos;
    return KTX_SUCCESS;
}